

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

void sqlcheck::CheckVariableAttribute
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  long lVar1;
  string title;
  string local_b0;
  string local_90;
  regex pattern;
  string table_name;
  
  GetTableName(&table_name,sql_statement);
  if (table_name._M_string_length != 0) {
    lVar1 = std::__cxx11::string::find((char *)&table_name,0x17e502,0);
    if (lVar1 != -1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&pattern,"(attribute)",0x10);
      title._M_dataplus._M_p = (pointer)&title.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&title,"Entity-Attribute-Value Pattern","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,title._M_dataplus._M_p,
                 title._M_dataplus._M_p + title._M_string_length);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,anon_var_dwarf_d04f0,anon_var_dwarf_d04f0 + 0x6a4);
      CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_MEDIUM,
                   PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_b0,&local_90,true,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)title._M_dataplus._M_p != &title.field_2) {
        operator_delete(title._M_dataplus._M_p);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)table_name._M_dataplus._M_p != &table_name.field_2) {
    operator_delete(table_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CheckVariableAttribute(Configuration& state,
                            const std::string& sql_statement,
                            bool& print_statement){

  std::string table_name = GetTableName(sql_statement);
  if(table_name.empty()){
    return;
  }

  auto found = table_name.find("attribute");
  if (found == std::string::npos) {
    return;
  }

  std::regex pattern("(attribute)");
  std::string title = "Entity-Attribute-Value Pattern";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Dynamic schema with variable attributes:  "
      "Are you trying to create a schema where you can define new attributes "
      "at runtime.? This involves storing attributes as rows in an attribute table. "
      "This is referred to as the Entity-Attribute-Value or schemaless pattern. "
      "When you use this pattern,  you sacrifice many advantages that a conventional "
      "database design would have given you. You can't make mandatory attributes. "
      "You can't enforce referential integrity. You might find that attributes are "
      "not being named consistently. A solution is to store all related types in one table, "
      "with distinct columns for every attribute that exists in any type "
      "(Single Table Inheritance). Use one attribute to define the subtype of a given row. "
      "Many attributes are subtype-specific, and these columns must "
      "be given a null value on any row storing an object for which the attribute "
      "does not apply; the columns with non-null values become sparse. "
      "Another solution is to create a separate table for each subtype "
      "(Concrete Table Inheritance). A third solution mimics inheritance, "
      "as though tables were object-oriented classes (Class Table Inheritance). "
      "Create a single table for the base type, containing attributes common to "
      "all subtypes. Then for each subtype, create another table, with a primary key "
      "that also serves as a foreign key to the base table. "
      "If you have many subtypes or if you must support new attributes frequently, "
      "you can add a BLOB column to store data in a format such as XML or JSON, "
      "which encodes both the attribute names and their values. "
      "This design is best when you can’t limit yourself to a finite set of subtypes "
      "and when you need complete flexibility to define new attributes at any time.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               true);

}